

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

ImGuiOldColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  int iVar1;
  int iVar2;
  ImGuiOldColumns *pIVar3;
  ulong uVar4;
  ImGuiOldColumns *in_RAX;
  ImGuiOldColumns *pIVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  undefined1 auStack_a8 [104];
  void *local_40;
  ImDrawListSplitter local_38;
  
  iVar1 = (window->ColumnsStorage).Size;
  uVar9 = (ulong)iVar1;
  bVar10 = 0 < (long)uVar9;
  if ((0 < (long)uVar9) && (in_RAX = (window->ColumnsStorage).Data, in_RAX->ID != id)) {
    uVar4 = 1;
    do {
      uVar7 = uVar4;
      if (uVar9 == uVar7) {
        bVar10 = uVar7 < uVar9;
        goto LAB_001583e7;
      }
      pIVar3 = in_RAX + 1;
      pIVar5 = in_RAX + 1;
      in_RAX = pIVar3;
      uVar4 = uVar7 + 1;
    } while (pIVar5->ID != id);
    bVar10 = uVar7 < uVar9;
  }
LAB_001583e7:
  if (!bVar10) {
    memset(auStack_a8,0,0x88);
    iVar2 = (window->ColumnsStorage).Capacity;
    if (iVar1 == iVar2) {
      if (iVar2 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar2 / 2 + iVar2;
      }
      iVar8 = iVar1 + 1;
      if (iVar1 + 1 < iVar6) {
        iVar8 = iVar6;
      }
      if (iVar2 < iVar8) {
        pIVar5 = (ImGuiOldColumns *)MemAlloc((long)iVar8 * 0x88);
        pIVar3 = (window->ColumnsStorage).Data;
        if (pIVar3 != (ImGuiOldColumns *)0x0) {
          memcpy(pIVar5,pIVar3,(long)(window->ColumnsStorage).Size * 0x88);
          MemFree((window->ColumnsStorage).Data);
        }
        (window->ColumnsStorage).Data = pIVar5;
        (window->ColumnsStorage).Capacity = iVar8;
      }
    }
    memcpy((window->ColumnsStorage).Data + (window->ColumnsStorage).Size,auStack_a8,0x88);
    (window->ColumnsStorage).Size = (window->ColumnsStorage).Size + 1;
    ImDrawListSplitter::ClearFreeMemory(&local_38);
    if (local_38._Channels.Data != (ImDrawChannel *)0x0) {
      MemFree(local_38._Channels.Data);
    }
    if (local_40 != (void *)0x0) {
      MemFree(local_40);
    }
    in_RAX = (window->ColumnsStorage).Data + (long)(window->ColumnsStorage).Size + -1;
    in_RAX->ID = id;
  }
  return in_RAX;
}

Assistant:

ImGuiOldColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiOldColumns());
    ImGuiOldColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}